

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void PO_Init(void)

{
  TArray<vertex_t_*,_vertex_t_*> *this;
  BYTE *pBVar1;
  FPolyObj *this_00;
  uint *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  short sVar5;
  long lVar6;
  vertex_t *pvVar7;
  side_t **ppsVar8;
  line_t_conflict **pplVar9;
  vertex_t **ppvVar10;
  FPolyVertex *pFVar11;
  double *pdVar12;
  undefined1 auVar13 [16];
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  node_t *pnVar20;
  uint uVar21;
  ulong *puVar22;
  subsector_t *psVar23;
  FPolyObj *pFVar24;
  byte bVar25;
  side_t *psVar26;
  polyspawns_t *ppVar27;
  sidei_t *psVar28;
  int *piVar29;
  ulong uVar30;
  polyspawns_t *ppVar31;
  side_t *psVar32;
  polyspawns_t *ppVar33;
  size_t sVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  line_t_conflict *plVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  ulong uVar42;
  bool bVar43;
  double dVar44;
  double dVar45;
  TArray<side_t_*,_side_t_*> local_48;
  
  if (0 < numsides) {
    lVar39 = 0xa0;
    lVar41 = 0;
    psVar26 = sides;
    iVar36 = numsides;
    do {
      lVar6 = *(long *)((long)psVar26->textures + lVar39 + -0x10);
      if ((lVar6 != 0) && ((*(uint *)(lVar6 + 0x28) | 4) == 5)) {
        TArray<int,_int>::Grow(&KnownPolySides,1);
        KnownPolySides.Array[KnownPolySides.Count] = (int)lVar41;
        KnownPolySides.Count = KnownPolySides.Count + 1;
        psVar26 = sides;
        iVar36 = numsides;
      }
      lVar41 = lVar41 + 1;
      lVar39 = lVar39 + 0xc0;
    } while (lVar41 < iVar36);
  }
  uVar30 = (ulong)po_NumPolyobjs;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar30;
  uVar42 = 0xffffffffffffffff;
  if (SUB168(auVar13 * ZEXT816(0xf0),8) == 0) {
    uVar42 = SUB168(auVar13 * ZEXT816(0xf0),0) | 8;
  }
  puVar22 = (ulong *)operator_new__(uVar42);
  polyobjs = (FPolyObj *)(puVar22 + 1);
  *puVar22 = uVar30;
  if (uVar30 != 0) {
    lVar39 = 0;
    do {
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 0x48);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 0x38);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 0x28);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 0x18);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 8);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 0x88);
      *puVar3 = 0x47efffffe0000000;
      puVar3[1] = 0xc7efffffe0000000;
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 0x78);
      *puVar3 = 0xc7efffffe0000000;
      puVar3[1] = 0x47efffffe0000000;
      *(undefined4 *)((long)puVar22 + lVar39 + 0xd0) = 0;
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 0x58);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 0xa8);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 0xb8);
      *puVar3 = 0;
      puVar3[1] = 0;
      *(undefined8 *)((long)puVar22 + lVar39 + 0xc6) = 0;
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 0xd8);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)((long)puVar22 + lVar39 + 0xe8);
      *puVar3 = 0;
      puVar3[1] = 0;
      lVar39 = lVar39 + 0xf0;
    } while (uVar30 * 0xf0 - lVar39 != 0);
  }
  if (polyspawns != (polyspawns_t *)0x0) {
    iVar36 = 0;
    ppVar27 = polyspawns;
    ppVar31 = (polyspawns_t *)&polyspawns;
    do {
      pFVar24 = polyobjs;
      sVar5 = ppVar27->type;
      ppVar33 = ppVar27;
      if ((ushort)(sVar5 - 0xcU) < 3) {
        this_00 = polyobjs + iVar36;
        uVar14 = *(undefined4 *)((long)&(ppVar27->pos).X + 4);
        uVar15 = *(undefined4 *)&(ppVar27->pos).Y;
        uVar16 = *(undefined4 *)((long)&(ppVar27->pos).Y + 4);
        pFVar11 = &polyobjs[iVar36].StartSpot;
        *(undefined4 *)&(pFVar11->pos).X = *(undefined4 *)&(ppVar27->pos).X;
        *(undefined4 *)((long)&(pFVar11->pos).X + 4) = uVar14;
        *(undefined4 *)&(pFVar11->pos).Y = uVar15;
        *(undefined4 *)((long)&(pFVar11->pos).Y + 4) = uVar16;
        piVar29 = KnownPolySides.Array;
        psVar26 = sides;
        uVar35 = (uint)ppVar27->angle;
        uVar42 = (ulong)KnownPolySides.Count;
        if (uVar42 != 0) {
          uVar30 = 0;
LAB_004711be:
          lVar39 = (long)piVar29[uVar30];
          if (lVar39 < 0) goto LAB_004711ec;
          this_00->bBlocked = false;
          this_00->bHasPortals = '\0';
          plVar38 = psVar26[lVar39].linedef;
          if ((plVar38->special != 1) || (plVar38->args[0] != uVar35)) goto LAB_004711ec;
          psVar26 = psVar26 + lVar39;
          if ((this_00->Sidedefs).Count != 0) {
            I_Error("SpawnPolyobj: Polyobj %d already spawned.\n",(ulong)uVar35);
            plVar38 = psVar26->linedef;
            pFVar24 = polyobjs;
          }
          plVar38->special = 0;
          plVar38->args[0] = 0;
          if (IterFindPolySides(FPolyObj*,side_t*)::vnum == '\0') {
            PO_Init();
          }
          if (sidetemp == (sidei_t *)0x0) {
            __assert_fail("sidetemp != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                          ,0x5d3,"void IterFindPolySides(FPolyObj *, side_t *)");
          }
          if (DAT_017f0acc != 0) {
            DAT_017f0acc = 0;
          }
          uVar42 = *(long *)(psVar26->linedef->args +
                            (ulong)(psVar26->linedef->sidedef[0] != psVar26) * 2 + -0xb) -
                   (long)vertexes;
          TArray<unsigned_int,_unsigned_int>::Grow
                    ((TArray<unsigned_int,_unsigned_int> *)
                     &IterFindPolySides(FPolyObj*,side_t*)::vnum,1);
          lVar39 = IterFindPolySides(FPolyObj*,side_t*)::vnum;
          *(int *)(IterFindPolySides(FPolyObj*,side_t*)::vnum + (ulong)DAT_017f0acc * 4) =
               (int)(uVar42 >> 4);
          uVar21 = DAT_017f0acc + 1;
          DAT_017f0acc = uVar21;
          if (uVar21 != 0) {
            pFVar24 = pFVar24 + iVar36;
            uVar42 = 0;
            psVar28 = sidetemp;
            do {
              uVar37 = psVar28[*(uint *)(lVar39 + uVar42 * 4)].field_0.b.first;
              for (; uVar37 != 0xffffffff; uVar37 = sidetemp[uVar37].field_0.b.next) {
                psVar32 = sides + uVar37;
                TArray<side_t_*,_side_t_*>::Grow(&pFVar24->Sidedefs,1);
                uVar21 = (pFVar24->Sidedefs).Count;
                (pFVar24->Sidedefs).Array[uVar21] = psVar32;
                (pFVar24->Sidedefs).Count = uVar21 + 1;
                uVar30 = (ulong)(DAT_017f0acc - 1);
                do {
                  bVar43 = uVar30 == 0;
                  uVar30 = uVar30 - 1;
                  iVar40 = (int)((ulong)(*(long *)((sides[uVar37].linedef)->args +
                                                  (ulong)((sides[uVar37].linedef)->sidedef[0] ==
                                                         sides + uVar37) * 2 + -0xb) -
                                        (long)vertexes) >> 4);
                  if (bVar43) {
                    TArray<unsigned_int,_unsigned_int>::Grow
                              ((TArray<unsigned_int,_unsigned_int> *)
                               &IterFindPolySides(FPolyObj*,side_t*)::vnum,1);
                    lVar39 = IterFindPolySides(FPolyObj*,side_t*)::vnum;
                    *(int *)(IterFindPolySides(FPolyObj*,side_t*)::vnum + (ulong)DAT_017f0acc * 4) =
                         iVar40;
                    DAT_017f0acc = DAT_017f0acc + 1;
                    break;
                  }
                  lVar39 = IterFindPolySides(FPolyObj*,side_t*)::vnum;
                } while (*(int *)(IterFindPolySides(FPolyObj*,side_t*)::vnum + uVar30 * 4) != iVar40
                        );
                psVar28 = sidetemp;
                uVar21 = DAT_017f0acc;
              }
              uVar37 = (int)uVar42 + 1;
              uVar42 = (ulong)uVar37;
            } while (uVar21 != uVar37);
          }
          plVar38 = psVar26->linedef;
          this_00->MirrorNum = plVar38->args[1];
          this_00->crush = (uint)(sVar5 != 0xc) * 3;
          this_00->bHurtOnTouch = sVar5 == 0xe;
          this_00->tag = uVar35;
          uVar21 = plVar38->args[2];
          if (0x3f < uVar21) {
            uVar21 = 0;
          }
          this_00->seqType = uVar21;
        }
LAB_0047143d:
        if ((this_00->Sidedefs).Count == 0) {
          local_48.Array = (side_t **)0x0;
          local_48.Most = 0;
          local_48.Count = 0;
          uVar42 = (ulong)KnownPolySides.Count;
          if (KnownPolySides.Count == 0) {
            sVar34 = 0;
          }
          else {
            uVar21 = 0;
            uVar30 = 0;
            piVar29 = KnownPolySides.Array;
            do {
              lVar39 = (long)piVar29[uVar30];
              if (((-1 < lVar39) && (plVar38 = sides[lVar39].linedef, plVar38->special == 5)) &&
                 (plVar38->args[0] == uVar35)) {
                if (plVar38->args[1] == 0) {
                  I_Error("SpawnPolyobj: Explicit line missing order number in poly %d, linedef %d.\n"
                          ,(ulong)uVar35,
                          (ulong)(uint)((int)((ulong)((long)plVar38 - (long)lines) >> 3) *
                                       0x286bca1b));
                }
                psVar26 = sides;
                TArray<side_t_*,_side_t_*>::Grow(&this_00->Sidedefs,1);
                uVar21 = (this_00->Sidedefs).Count;
                (this_00->Sidedefs).Array[uVar21] = psVar26 + lVar39;
                uVar21 = uVar21 + 1;
                (this_00->Sidedefs).Count = uVar21;
                uVar42 = (ulong)KnownPolySides.Count;
                piVar29 = KnownPolySides.Array;
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 < uVar42);
            sVar34 = (size_t)uVar21;
          }
          qsort((this_00->Sidedefs).Array,sVar34,8,posicmp);
          if ((this_00->Sidedefs).Count == 0) {
            I_Error("SpawnPolyobj: Poly %d does not exist\n",(ulong)uVar35);
          }
          else {
            this_00->crush = (uint)(sVar5 != 0xc) * 3;
            this_00->bHurtOnTouch = sVar5 == 0xe;
            this_00->tag = uVar35;
            plVar38 = (*(this_00->Sidedefs).Array)->linedef;
            this_00->seqType = plVar38->args[3];
            this_00->MirrorNum = plVar38->args[2];
          }
          TArray<side_t_*,_side_t_*>::~TArray(&local_48);
        }
        validcount = validcount + 1;
        if ((this_00->Sidedefs).Count != 0) {
          this = &this_00->Vertices;
          uVar42 = 0;
          do {
            iVar40 = validcount;
            plVar38 = (this_00->Sidedefs).Array[uVar42]->linedef;
            if (plVar38->validcount != validcount) {
              uVar35 = plVar38->portalindex;
              if (((linePortals.Array != (FLinePortal *)0x0 && uVar35 < linePortals.Count) &&
                  ((linePortals.Array[uVar35].mDefFlags & 2) != 0)) &&
                 (bVar25 = (linePortals.Array[uVar35].mType == '\x03') + 1,
                 this_00->bHasPortals < bVar25)) {
                this_00->bHasPortals = bVar25;
              }
              plVar38->validcount = iVar40;
              TArray<line_t_*,_line_t_*>::Grow(&this_00->Linedefs,1);
              uVar35 = (this_00->Linedefs).Count;
              (this_00->Linedefs).Array[uVar35] = plVar38;
              (this_00->Linedefs).Count = uVar35 + 1;
              pvVar7 = plVar38->v1;
              uVar35 = (this_00->Vertices).Count;
              uVar21 = uVar35;
              do {
                uVar21 = uVar21 - 1;
                if ((int)uVar21 < 0) {
                  TArray<vertex_t_*,_vertex_t_*>::Grow(this,1);
                  uVar35 = (this_00->Vertices).Count;
                  (this_00->Vertices).Array[uVar35] = pvVar7;
                  uVar35 = uVar35 + 1;
                  (this_00->Vertices).Count = uVar35;
                  break;
                }
              } while (this->Array[uVar21 & 0x7fffffff] != pvVar7);
              pvVar7 = plVar38->v2;
              do {
                uVar35 = uVar35 - 1;
                if ((int)uVar35 < 0) {
                  TArray<vertex_t_*,_vertex_t_*>::Grow(this,1);
                  uVar35 = (this_00->Vertices).Count;
                  (this_00->Vertices).Array[uVar35] = pvVar7;
                  (this_00->Vertices).Count = uVar35 + 1;
                  break;
                }
              } while (this->Array[uVar35 & 0x7fffffff] != pvVar7);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 < (this_00->Sidedefs).Count);
        }
        TArray<side_t_*,_side_t_*>::ShrinkToFit(&this_00->Sidedefs);
        TArray<line_t_*,_line_t_*>::ShrinkToFit(&this_00->Linedefs);
        TArray<vertex_t_*,_vertex_t_*>::ShrinkToFit(&this_00->Vertices);
        iVar36 = iVar36 + 1;
        ppVar31->next = ppVar27->next;
        operator_delete(ppVar27,0x20);
        ppVar33 = ppVar31;
      }
      ppVar27 = ppVar33->next;
      ppVar31 = ppVar33;
      ppVar33 = polyspawns;
    } while (ppVar27 != (polyspawns_t *)0x0);
    while (ppVar33 != (polyspawns_t *)0x0) {
      ppVar27 = ppVar33->next;
      if (ppVar33->type == 0xb) {
        uVar35 = (uint)ppVar33->angle;
        lVar39 = (long)po_NumPolyobjs;
        pFVar24 = polyobjs;
        if (0 < lVar39) {
          do {
            if (pFVar24->tag == uVar35) goto LAB_0047179a;
            lVar39 = lVar39 + -1;
            pFVar24 = pFVar24 + 1;
          } while (lVar39 != 0);
        }
        I_Error("TranslateToStartSpot: Unable to match polyobj tag: %d\n",(ulong)uVar35);
        pFVar24 = (FPolyObj *)0x0;
LAB_0047179a:
        uVar21 = (pFVar24->Sidedefs).Count;
        if (uVar21 == 0) {
          I_Error("TranslateToStartSpot: Anchor point located without a StartSpot point: %d\n",
                  (ulong)uVar35);
          uVar21 = (pFVar24->Sidedefs).Count;
        }
        puVar2 = &(pFVar24->OriginalPts).Count;
        uVar37 = uVar21 - *puVar2;
        uVar35 = uVar21;
        if (*puVar2 <= uVar21 && uVar37 != 0) {
          TArray<FPolyVertex,_FPolyVertex>::Grow(&pFVar24->OriginalPts,uVar37);
          uVar35 = (pFVar24->Sidedefs).Count;
        }
        (pFVar24->OriginalPts).Count = uVar21;
        puVar2 = &(pFVar24->PrevPts).Count;
        uVar37 = uVar35 - *puVar2;
        uVar21 = uVar35;
        if (*puVar2 <= uVar35 && uVar37 != 0) {
          TArray<FPolyVertex,_FPolyVertex>::Grow(&pFVar24->PrevPts,uVar37);
          uVar21 = (pFVar24->Sidedefs).Count;
        }
        (pFVar24->PrevPts).Count = uVar35;
        dVar45 = (ppVar33->pos).X;
        dVar44 = (ppVar33->pos).Y;
        dVar17 = (pFVar24->StartSpot).pos.X;
        dVar18 = (pFVar24->StartSpot).pos.Y;
        if (uVar21 != 0) {
          ppsVar8 = (pFVar24->Sidedefs).Array;
          uVar42 = 0;
          do {
            pBVar1 = &ppsVar8[uVar42]->Flags;
            *pBVar1 = *pBVar1 | 0x40;
            uVar42 = uVar42 + 1;
          } while (uVar21 != uVar42);
        }
        dVar45 = dVar45 - dVar17;
        dVar44 = dVar44 - dVar18;
        uVar42 = (ulong)(pFVar24->Linedefs).Count;
        if (uVar42 != 0) {
          pplVar9 = (pFVar24->Linedefs).Array;
          uVar30 = 0;
          do {
            plVar38 = pplVar9[uVar30];
            dVar17 = plVar38->bbox[1];
            dVar18 = plVar38->bbox[2];
            dVar19 = plVar38->bbox[3];
            plVar38->bbox[0] = plVar38->bbox[0] - dVar44;
            plVar38->bbox[1] = dVar17 - dVar44;
            plVar38->bbox[2] = dVar18 - dVar45;
            plVar38->bbox[3] = dVar19 - dVar45;
            uVar30 = uVar30 + 1;
          } while (uVar42 != uVar30);
        }
        uVar42 = (ulong)(pFVar24->Vertices).Count;
        if (uVar42 != 0) {
          ppvVar10 = (pFVar24->Vertices).Array;
          pFVar11 = (pFVar24->OriginalPts).Array;
          lVar39 = 0;
          do {
            pdVar12 = *(double **)((long)ppvVar10 + lVar39);
            dVar17 = *pdVar12;
            dVar18 = pdVar12[1];
            *pdVar12 = dVar17 - dVar45;
            pdVar12[1] = dVar18 - dVar44;
            dVar19 = (pFVar24->StartSpot).pos.Y;
            pdVar12 = (double *)((long)&(pFVar11->pos).X + lVar39 * 2);
            *pdVar12 = (dVar17 - dVar45) - (pFVar24->StartSpot).pos.X;
            pdVar12[1] = (dVar18 - dVar44) - dVar19;
            lVar39 = lVar39 + 8;
          } while (uVar42 << 3 != lVar39);
        }
        FPolyObj::CalcCenter(pFVar24);
        psVar23 = R_PointInSubsector(SUB84((pFVar24->CenterSpot).pos.X + 103079215104.0,0),
                                     SUB84((pFVar24->CenterSpot).pos.Y + 103079215104.0,0));
        pFVar24->CenterSubsector = psVar23;
      }
      operator_delete(ppVar33,0x20);
      ppVar33 = ppVar27;
    }
  }
  polyspawns = (polyspawns_t *)0x0;
  if (po_NumPolyobjs < 1) {
    sVar34 = (long)bmapheight * (long)bmapwidth * 8;
    uVar42 = 0xffffffffffffffff;
    if (-1 < (int)((long)bmapheight * (long)bmapwidth)) {
      uVar42 = sVar34;
    }
    PolyBlockMap = (polyblock_t **)operator_new__(uVar42);
    memset(PolyBlockMap,0,sVar34);
  }
  else {
    lVar39 = 0xa8;
    lVar41 = 0;
    pFVar24 = polyobjs;
    iVar36 = po_NumPolyobjs;
    do {
      if (*(int *)((long)pFVar24 + lVar39 + -0x6c) == 0) {
        I_Error("PO_Init: StartSpot located without an Anchor point: %d\n");
        pFVar24 = polyobjs;
        iVar36 = po_NumPolyobjs;
      }
      lVar41 = lVar41 + 1;
      lVar39 = lVar39 + 0xf0;
    } while (lVar41 < iVar36);
    sVar34 = (long)bmapheight * (long)bmapwidth * 8;
    uVar42 = 0xffffffffffffffff;
    if (-1 < (int)((long)bmapheight * (long)bmapwidth)) {
      uVar42 = sVar34;
    }
    PolyBlockMap = (polyblock_t **)operator_new__(uVar42);
    memset(PolyBlockMap,0,sVar34);
    if (0 < iVar36) {
      lVar39 = 0;
      lVar41 = 0;
      do {
        FPolyObj::LinkPolyobj((FPolyObj *)((long)(polyobjs->Bounds).m_Box + lVar39 + -0x70));
        lVar41 = lVar41 + 1;
        lVar39 = lVar39 + 0xf0;
      } while (lVar41 < po_NumPolyobjs);
    }
  }
  if (KnownPolySides.Count != 0) {
    KnownPolySides.Count = 0;
  }
  TArray<int,_int>::ShrinkToFit(&KnownPolySides);
  if (0 < numnodes) {
    lVar39 = 0x30;
    lVar41 = 0;
    do {
      pnVar20 = nodes;
      uVar4 = *(undefined8 *)((long)nodes + lVar39 + -0x28);
      dVar45 = (double)(int)uVar4 * 1.52587890625e-05;
      dVar44 = (double)(int)((ulong)uVar4 >> 0x20) * 1.52587890625e-05;
      dVar45 = c_sqrt(dVar44 * dVar44 + dVar45 * dVar45);
      *(float *)((long)&pnVar20->x + lVar39) = (float)dVar45;
      lVar41 = lVar41 + 1;
      lVar39 = lVar39 + 0x48;
    } while (lVar41 < numnodes);
  }
  psVar23 = subsectors;
  if (0 < numsubsectors) {
    lVar39 = 0;
    iVar36 = numsubsectors;
    do {
      if ((ulong)psVar23[lVar39].numlines != 0) {
        lVar41 = 0;
        do {
          lVar6 = *(long *)((long)&(psVar23[lVar39].firstline)->sidedef + lVar41);
          if ((lVar6 != 0) && ((*(byte *)(lVar6 + 0xb4) & 0x40) != 0)) {
            *(byte *)&psVar23[lVar39].flags = (byte)psVar23[lVar39].flags | 4;
            iVar36 = numsubsectors;
            break;
          }
          lVar41 = lVar41 + 0x30;
        } while ((ulong)psVar23[lVar39].numlines * 0x30 != lVar41);
      }
      lVar39 = lVar39 + 1;
    } while (lVar39 < iVar36);
  }
  if (0 < numlines) {
    piVar29 = &lines->special;
    lVar39 = 0;
    iVar36 = numlines;
    do {
      if ((*piVar29 | 4U) == 5) {
        *piVar29 = 0;
        iVar36 = numlines;
      }
      lVar39 = lVar39 + 1;
      piVar29 = piVar29 + 0x26;
    } while (lVar39 < iVar36);
  }
  return;
LAB_004711ec:
  uVar30 = uVar30 + 1;
  if (uVar42 == uVar30) goto LAB_0047143d;
  goto LAB_004711be;
}

Assistant:

static void InitSideLists ()
{
	for (int i = 0; i < numsides; ++i)
	{
		if (sides[i].linedef != NULL &&
			(sides[i].linedef->special == Polyobj_StartLine ||
			 sides[i].linedef->special == Polyobj_ExplicitLine))
		{
			KnownPolySides.Push (i);
		}
	}
}